

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

CTPNStmTop * __thiscall
CTcParser::parse_object
          (CTcParser *this,int *err,int replace,int modify,int is_class,int plus_cnt,int trans)

{
  CTcToken *pCVar1;
  CTPNStmTop *pCVar2;
  undefined4 in_stack_00000008;
  newline_spacing_mode_t in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  char *in_stack_00000018;
  CCharmapToUni *in_stack_00000020;
  CTcParser *in_stack_00000028;
  CTcTokFileDesc *in_stack_00000040;
  CTcSymMetaclass **in_stack_00000048;
  CTcSymObj *obj_sym;
  CTcSymMetaclass *meta_sym;
  CTcSymObj *mod_orig_sym;
  int in_stack_0000012c;
  int in_stack_00000130;
  int in_stack_00000134;
  tok_embed_level *in_stack_00000138;
  int *in_stack_00000140;
  CTcParser *in_stack_00000148;
  int in_stack_00000160;
  wchar_t in_stack_00000168;
  CTcSymObj *in_stack_00000170;
  wchar_t in_stack_00000178;
  CTcSymMetaclass *in_stack_00000180;
  tcprs_term_info *in_stack_00000188;
  int in_stack_00000190;
  CTcTokenizer *this_00;
  
  pCVar1 = CTcTokenizer::getcur(G_tok);
  CTcToken::get_text(pCVar1);
  pCVar1 = CTcTokenizer::getcur(G_tok);
  CTcToken::get_text_len(pCVar1);
  this_00 = (CTcTokenizer *)&stack0x00000008;
  find_or_def_obj(in_stack_00000028,(char *)in_stack_00000020,(size_t)in_stack_00000018,
                  in_stack_00000014,in_stack_00000010,
                  (int *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                  (CTcSymObj **)in_stack_00000040,in_stack_00000048,(int *)obj_sym);
  CTcTokenizer::next(this_00);
  pCVar2 = (CTPNStmTop *)
           parse_object_body(in_stack_00000148,in_stack_00000140,(CTcSymObj *)in_stack_00000138,
                             in_stack_00000134,in_stack_00000130,in_stack_0000012c,in_stack_00000160
                             ,in_stack_00000168,in_stack_00000170,in_stack_00000178,
                             in_stack_00000180,in_stack_00000188,in_stack_00000190);
  return pCVar2;
}

Assistant:

CTPNStmTop *CTcParser::parse_object(
    int *err, int replace, int modify, int is_class, int plus_cnt, int trans)
{
    /* find or define the symbol */
    CTcSymObj *mod_orig_sym;
    CTcSymMetaclass *meta_sym;
    CTcSymObj *obj_sym = find_or_def_obj(
        G_tok->getcur()->get_text(), G_tok->getcur()->get_text_len(),
        replace, modify, &is_class, &mod_orig_sym, &meta_sym, &trans);

    /* skip the object name */
    G_tok->next();

    /* parse the body */
    return parse_object_body(
        err, obj_sym, is_class, FALSE, FALSE, FALSE,
        modify, mod_orig_sym, plus_cnt, meta_sym, 0, trans);
}